

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_TextureCoordinates * __thiscall
ON_Mesh::GetCachedTextureCoordinates
          (ON_Mesh *this,ONX_Model *onx_model,ON_Texture *texture,ON_MappingRef *mapping_ref)

{
  ON_TextureCoordinates *pOVar1;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_50;
  anon_class_8_1_76421483 local_30;
  anon_class_8_1_76421483 get_mapping_func;
  ON_MappingRef *mapping_ref_local;
  ON_Texture *texture_local;
  ONX_Model *onx_model_local;
  ON_Mesh *this_local;
  
  local_30.onx_model = onx_model;
  get_mapping_func.onx_model = (ONX_Model *)mapping_ref;
  std::function<ON_TextureMapping(ON_MappingChannel_const*)>::
  function<ON_Mesh::GetCachedTextureCoordinates(ONX_Model_const&,ON_Texture_const&,ON_MappingRef_const*)const::__0&,void>
            ((function<ON_TextureMapping(ON_MappingChannel_const*)> *)&local_50,&local_30);
  pOVar1 = Internal_GetCachedTextureCoordinates
                     (this,&local_50,texture,(ON_MappingRef *)get_mapping_func.onx_model);
  std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::~function(&local_50);
  return pOVar1;
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::GetCachedTextureCoordinates(const ONX_Model& onx_model, const ON_Texture& texture, const ON_MappingRef* mapping_ref) const
{
  auto get_mapping_func = [&onx_model](const ON_MappingChannel* pMC)
    {
      return ONX_Model_GetTextureMappingHelper(onx_model, pMC);
    };

  return ::Internal_GetCachedTextureCoordinates(*this, get_mapping_func, texture, mapping_ref);
}